

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_tree_renderer.cpp
# Opt level: O3

void __thiscall
duckdb::TextTreeRenderer::RenderBottomLayer
          (TextTreeRenderer *this,RenderTree *root,ostream *ss,idx_t y)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  ulong uVar4;
  optional_ptr<duckdb::RenderTreeNode,_true> oVar5;
  size_t sVar6;
  ulong x;
  ulong x_00;
  char *pcVar7;
  allocator local_89;
  string local_88;
  string local_68;
  TextTreeRenderer *local_48;
  ostream *local_40;
  idx_t local_38;
  
  local_38 = y + 1;
  x = 0;
  local_48 = this;
  local_40 = ss;
  do {
    if ((this->config).maximum_render_width <= (this->config).node_render_width * x) break;
    uVar4 = root->width;
    if (x < uVar4) {
      x_00 = x;
      bVar3 = false;
      do {
        bVar2 = true;
        if (bVar3 == false) {
          bVar2 = RenderTree::HasNode(root,x_00,y);
          uVar4 = root->width;
        }
        x_00 = x_00 + 1;
        bVar3 = bVar2;
      } while (x_00 < uVar4);
    }
    else {
      bVar2 = false;
    }
    oVar5 = RenderTree::GetNode(root,x,y);
    ss = local_40;
    if (oVar5.ptr == (RenderTreeNode *)0x0) {
      bVar3 = RenderTree::HasNode(root,x,local_38);
      ss = local_40;
      this = local_48;
      if (bVar3) {
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_68," ","");
        StringUtil::Repeat(&local_88,&local_68,(local_48->config).node_render_width >> 1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  (ss,(char *)CONCAT71(local_88._M_dataplus._M_p._1_7_,
                                       local_88._M_dataplus._M_p._0_1_),local_88._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_88._M_dataplus._M_p._1_7_,local_88._M_dataplus._M_p._0_1_) !=
            &local_88.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_88._M_dataplus._M_p._1_7_,local_88._M_dataplus._M_p._0_1_))
          ;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p);
        }
        ss = local_40;
        pcVar7 = (local_48->config).VERTICAL;
        if (pcVar7 == (char *)0x0) {
          ::std::ios::clear((int)*(undefined8 *)(*(long *)local_40 + -0x18) + (int)local_40);
        }
        else {
          sVar6 = strlen(pcVar7);
          ss = local_40;
          ::std::__ostream_insert<char,std::char_traits<char>>(local_40,pcVar7,sVar6);
        }
        this = local_48;
        if ((bVar2 != false) || (bVar2 = ShouldRenderWhitespace(root,x,y), bVar2)) {
          local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_68," ","");
          StringUtil::Repeat(&local_88,&local_68,(this->config).node_render_width >> 1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    (ss,(char *)CONCAT71(local_88._M_dataplus._M_p._1_7_,
                                         local_88._M_dataplus._M_p._0_1_),local_88._M_string_length)
          ;
LAB_015a1015:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_88._M_dataplus._M_p._1_7_,local_88._M_dataplus._M_p._0_1_) !=
              &local_88.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_88._M_dataplus._M_p._1_7_,local_88._M_dataplus._M_p._0_1_
                                    ));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p != &local_68.field_2) {
            operator_delete(local_68._M_dataplus._M_p);
          }
        }
      }
      else if ((bVar2 != false) || (bVar2 = ShouldRenderWhitespace(root,x,y), bVar2)) {
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_68," ","");
        StringUtil::Repeat(&local_88,&local_68,(this->config).node_render_width);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  (ss,(char *)CONCAT71(local_88._M_dataplus._M_p._1_7_,
                                       local_88._M_dataplus._M_p._0_1_),local_88._M_string_length);
        goto LAB_015a1015;
      }
    }
    else {
      pcVar7 = (local_48->config).LDCORNER;
      iVar1 = (int)local_40;
      if (pcVar7 == (char *)0x0) {
        ::std::ios::clear((int)*(undefined8 *)(*(long *)local_40 + -0x18) + iVar1);
      }
      else {
        sVar6 = strlen(pcVar7);
        ::std::__ostream_insert<char,std::char_traits<char>>(ss,pcVar7,sVar6);
      }
      this = local_48;
      ::std::__cxx11::string::string((string *)&local_68,(local_48->config).HORIZONTAL,&local_89);
      StringUtil::Repeat(&local_88,&local_68,((this->config).node_render_width >> 1) - 1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (ss,(char *)CONCAT71(local_88._M_dataplus._M_p._1_7_,local_88._M_dataplus._M_p._0_1_
                                    ),local_88._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_88._M_dataplus._M_p._1_7_,local_88._M_dataplus._M_p._0_1_) !=
          &local_88.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_88._M_dataplus._M_p._1_7_,local_88._M_dataplus._M_p._0_1_));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p);
      }
      bVar2 = RenderTree::HasNode(root,x,local_38);
      if (bVar2) {
        pcVar7 = (this->config).TMIDDLE;
      }
      else {
        pcVar7 = (this->config).HORIZONTAL;
      }
      if (pcVar7 == (char *)0x0) {
        ::std::ios::clear((int)*(undefined8 *)(*(long *)ss + -0x18) + iVar1);
      }
      else {
        sVar6 = strlen(pcVar7);
        ::std::__ostream_insert<char,std::char_traits<char>>(ss,pcVar7,sVar6);
      }
      ::std::__cxx11::string::string((string *)&local_68,(this->config).HORIZONTAL,&local_89);
      StringUtil::Repeat(&local_88,&local_68,((this->config).node_render_width >> 1) - 1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (ss,(char *)CONCAT71(local_88._M_dataplus._M_p._1_7_,local_88._M_dataplus._M_p._0_1_
                                    ),local_88._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_88._M_dataplus._M_p._1_7_,local_88._M_dataplus._M_p._0_1_) !=
          &local_88.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_88._M_dataplus._M_p._1_7_,local_88._M_dataplus._M_p._0_1_));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p);
      }
      pcVar7 = (this->config).RDCORNER;
      if (pcVar7 == (char *)0x0) {
        ::std::ios::clear((int)*(undefined8 *)(*(long *)ss + -0x18) + iVar1);
      }
      else {
        sVar6 = strlen(pcVar7);
        ::std::__ostream_insert<char,std::char_traits<char>>(ss,pcVar7,sVar6);
      }
    }
    x = x + 1;
  } while (x <= root->width);
  local_88._M_dataplus._M_p._0_1_ = 10;
  ::std::__ostream_insert<char,std::char_traits<char>>(ss,(char *)&local_88,1);
  return;
}

Assistant:

void TextTreeRenderer::RenderBottomLayer(RenderTree &root, std::ostream &ss, idx_t y) {
	for (idx_t x = 0; x <= root.width; x++) {
		if (x * config.node_render_width >= config.maximum_render_width) {
			break;
		}
		bool has_adjacent_nodes = false;
		for (idx_t i = 0; x + i < root.width; i++) {
			has_adjacent_nodes = has_adjacent_nodes || root.HasNode(x + i, y);
		}
		auto node = root.GetNode(x, y);
		if (node) {
			ss << config.LDCORNER;
			ss << StringUtil::Repeat(config.HORIZONTAL, config.node_render_width / 2 - 1);
			if (root.HasNode(x, y + 1)) {
				// node below this one: connect to that one
				ss << config.TMIDDLE;
			} else {
				// no node below this one: end the box
				ss << config.HORIZONTAL;
			}
			ss << StringUtil::Repeat(config.HORIZONTAL, config.node_render_width / 2 - 1);
			ss << config.RDCORNER;
		} else if (root.HasNode(x, y + 1)) {
			ss << StringUtil::Repeat(" ", config.node_render_width / 2);
			ss << config.VERTICAL;
			if (has_adjacent_nodes || ShouldRenderWhitespace(root, x, y)) {
				ss << StringUtil::Repeat(" ", config.node_render_width / 2);
			}
		} else {
			if (has_adjacent_nodes || ShouldRenderWhitespace(root, x, y)) {
				ss << StringUtil::Repeat(" ", config.node_render_width);
			}
		}
	}
	ss << '\n';
}